

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
zeGetRTASParallelOperationExpProcAddrTable
          (ze_api_version_t version,ze_rtas_parallel_operation_exp_dditable_t *pDdiTable)

{
  ze_pfnRTASParallelOperationCreateExp_t p_Var1;
  ze_pfnRTASParallelOperationGetPropertiesExp_t p_Var2;
  ze_pfnRTASParallelOperationJoinExp_t p_Var3;
  ze_pfnRTASParallelOperationDestroyExp_t p_Var4;
  long lVar5;
  bool bVar6;
  size_type sVar7;
  vector<loader::driver_t,_std::allocator<loader::driver_t>_> *this;
  reference pdVar8;
  reference pvVar9;
  code *pcVar10;
  ze_rtas_parallel_operation_exp_dditable_t dditable;
  ze_pfnGetRTASParallelOperationExpProcAddrTable_t getTable_2;
  ze_pfnGetRTASParallelOperationExpProcAddrTable_t getTable_1;
  ze_pfnGetRTASParallelOperationExpProcAddrTable_t getTable;
  driver_t *drv;
  iterator __end1;
  iterator __begin1;
  driver_vector_t *__range1;
  ze_result_t result;
  ze_rtas_parallel_operation_exp_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  sVar7 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                    ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                     (loader::context + 0x15e0));
  if (sVar7 == 0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else if (pDdiTable == (ze_rtas_parallel_operation_exp_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (*(int *)(loader::context + 0x15c0) < (int)version) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  else {
    __range1._4_4_ = ZE_RESULT_SUCCESS;
    this = (vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)(loader::context + 0x15e0)
    ;
    __end1 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::begin(this);
    drv = (driver_t *)std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::end(this);
    while (bVar6 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                                       *)&drv), bVar6) {
      pdVar8 = __gnu_cxx::
               __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
               ::operator*(&__end1);
      if ((pdVar8->initStatus == ZE_RESULT_SUCCESS) &&
         (pcVar10 = (code *)dlsym(pdVar8->handle,"zeGetRTASParallelOperationExpProcAddrTable"),
         pcVar10 != (code *)0x0)) {
        __range1._4_4_ = (*pcVar10)(version,&(pdVar8->dditable).ze.RTASParallelOperationExp);
      }
      __gnu_cxx::
      __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
      ::operator++(&__end1);
    }
    if (__range1._4_4_ == ZE_RESULT_SUCCESS) {
      sVar7 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                        ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                         (loader::context + 0x15e0));
      if ((sVar7 < 2) && ((*(byte *)(loader::context + 0x1629) & 1) == 0)) {
        pvVar9 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::front
                           ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                            (loader::context + 0x15e0));
        pDdiTable->pfnCreateExp = (pvVar9->dditable).ze.RTASParallelOperationExp.pfnCreateExp;
        pDdiTable->pfnGetPropertiesExp =
             (pvVar9->dditable).ze.RTASParallelOperationExp.pfnGetPropertiesExp;
        pDdiTable->pfnJoinExp = (pvVar9->dditable).ze.RTASParallelOperationExp.pfnJoinExp;
        pDdiTable->pfnDestroyExp = (pvVar9->dditable).ze.RTASParallelOperationExp.pfnDestroyExp;
      }
      else {
        pDdiTable->pfnCreateExp = loader::zeRTASParallelOperationCreateExp;
        pDdiTable->pfnGetPropertiesExp = loader::zeRTASParallelOperationGetPropertiesExp;
        pDdiTable->pfnJoinExp = loader::zeRTASParallelOperationJoinExp;
        pDdiTable->pfnDestroyExp = loader::zeRTASParallelOperationDestroyExp;
      }
    }
    if ((__range1._4_4_ == ZE_RESULT_SUCCESS) && (*(long *)(loader::context + 0x1618) != 0)) {
      pcVar10 = (code *)dlsym(*(undefined8 *)(loader::context + 0x1618),
                              "zeGetRTASParallelOperationExpProcAddrTable");
      if (pcVar10 == (code *)0x0) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      __range1._4_4_ = (*pcVar10)(version,pDdiTable);
    }
    if ((__range1._4_4_ == ZE_RESULT_SUCCESS) && (*(long *)(loader::context + 0x1620) != 0)) {
      pcVar10 = (code *)dlsym(*(undefined8 *)(loader::context + 0x1620),
                              "zeGetRTASParallelOperationExpProcAddrTable");
      if (pcVar10 == (code *)0x0) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      p_Var1 = pDdiTable->pfnCreateExp;
      p_Var2 = pDdiTable->pfnGetPropertiesExp;
      p_Var3 = pDdiTable->pfnJoinExp;
      p_Var4 = pDdiTable->pfnDestroyExp;
      __range1._4_4_ = (*pcVar10)((ze_rtas_parallel_operation_exp_handle_t)version);
      lVar5 = loader::context;
      *(ze_pfnRTASParallelOperationCreateExp_t *)(loader::context + 0x16c8) = p_Var1;
      *(ze_pfnRTASParallelOperationGetPropertiesExp_t *)(lVar5 + 0x16d0) = p_Var2;
      *(ze_pfnRTASParallelOperationJoinExp_t *)(lVar5 + 0x16d8) = p_Var3;
      *(ze_pfnRTASParallelOperationDestroyExp_t *)(lVar5 + 0x16e0) = p_Var4;
      if ((*(byte *)(loader::context + 0x1652) & 1) != 0) {
        __range1._4_4_ = (*pcVar10)((ze_rtas_parallel_operation_exp_handle_t)version);
      }
    }
    pDdiTable_local._4_4_ = __range1._4_4_;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetRTASParallelOperationExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_rtas_parallel_operation_exp_dditable_t* pDdiTable///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<ze_pfnGetRTASParallelOperationExpProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zeGetRTASParallelOperationExpProcAddrTable") );
        if(!getTable) 
            continue; 
        result = getTable( version, &drv.dditable.ze.RTASParallelOperationExp);
    }


    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnCreateExp                                = loader::zeRTASParallelOperationCreateExp;
            pDdiTable->pfnGetPropertiesExp                         = loader::zeRTASParallelOperationGetPropertiesExp;
            pDdiTable->pfnJoinExp                                  = loader::zeRTASParallelOperationJoinExp;
            pDdiTable->pfnDestroyExp                               = loader::zeRTASParallelOperationDestroyExp;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.ze.RTASParallelOperationExp;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetRTASParallelOperationExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zeGetRTASParallelOperationExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    // If the API tracing layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->tracingLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetRTASParallelOperationExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->tracingLayer, "zeGetRTASParallelOperationExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        ze_rtas_parallel_operation_exp_dditable_t dditable;
        memcpy(&dditable, pDdiTable, sizeof(ze_rtas_parallel_operation_exp_dditable_t));
        result = getTable( version, &dditable );
        loader::context->tracing_dditable.ze.RTASParallelOperationExp = dditable;
        if ( loader::context->tracingLayerEnabled ) {
            result = getTable( version, pDdiTable );
        }
    }

    return result;
}